

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_erase_result_t * art_erase_at(art_t *art,art_ref_t ref,art_key_chunk_t *key,uint8_t depth)

{
  _Bool _Var1;
  uint8_t uVar2;
  uint8_t uVar3;
  art_key_chunk_t *key1;
  uint8_t *puVar4;
  art_ref_t aVar5;
  art_node_t *new_child;
  art_key_chunk_t *in_RCX;
  art_t *in_RDX;
  art_t *in_RSI;
  art_erase_result_t *in_RDI;
  uint8_t in_R8B;
  art_erase_result_t child_result;
  art_ref_t child;
  art_key_chunk_t key_chunk;
  uint8_t common_prefix;
  art_inner_node_t *inner_node;
  uint8_t common_prefix_1;
  art_leaf_t *leaf;
  art_key_chunk_t in_stack_ffffffffffffff6e;
  art_typecode_t in_stack_ffffffffffffff6f;
  art_inner_node_t *in_stack_ffffffffffffff70;
  art_typecode_t typecode;
  art_inner_node_t *in_stack_ffffffffffffff78;
  undefined2 uVar6;
  art_t *in_stack_ffffffffffffff80;
  art_ref_t local_60;
  byte local_58;
  art_val_t local_50;
  undefined8 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar2 = (uint8_t)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  in_RDI->rootmost_node = 0;
  in_RDI->erased = false;
  _Var1 = art_is_leaf(0x135dbb);
  if (_Var1) {
    key1 = (art_key_chunk_t *)
           art_deref(in_stack_ffffffffffffff80,(art_ref_t)in_stack_ffffffffffffff78);
    typecode = (art_typecode_t)((ulong)in_stack_ffffffffffffff70 >> 0x38);
    uVar2 = art_common_prefix(key1,'\0','\x06',in_RCX,'\0','\x06');
    if (uVar2 == '\x06') {
      in_RDI->erased = true;
      in_RDI->value_erased = *(art_val_t *)(key1 + 8);
      art_node_free(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,typecode);
    }
  }
  else {
    puVar4 = (uint8_t *)art_deref(in_stack_ffffffffffffff80,(art_ref_t)in_stack_ffffffffffffff78);
    uVar3 = art_common_prefix(puVar4 + 1,'\0',*puVar4,in_RCX,in_R8B,'\x06');
    if (uVar3 == *puVar4) {
      art_ref_typecode((art_ref_t)in_RDX);
      aVar5 = art_find_child(in_stack_ffffffffffffff78,
                             (art_typecode_t)((ulong)in_stack_ffffffffffffff70 >> 0x38),
                             (art_key_chunk_t)((ulong)in_stack_ffffffffffffff70 >> 0x30));
      if ((aVar5 != 0) &&
         (art_erase_at(in_RDX,(art_ref_t)in_RCX,
                       (art_key_chunk_t *)CONCAT17(in_R8B,in_stack_ffffffffffffffe0),uVar2),
         (local_58 & 1) != 0)) {
        in_RDI->erased = true;
        in_RDI->value_erased = local_50;
        in_RDI->rootmost_node = (art_ref_t)in_RDX;
        new_child = art_deref(in_stack_ffffffffffffff80,(art_ref_t)in_stack_ffffffffffffff78);
        uVar6 = (undefined2)((ulong)in_stack_ffffffffffffff78 >> 0x30);
        if (local_60 == 0) {
          art_ref_typecode((art_ref_t)in_RDX);
          aVar5 = art_node_erase(in_RSI,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f,
                                 in_stack_ffffffffffffff6e);
          in_RDI->rootmost_node = aVar5;
        }
        else if (local_60 != aVar5) {
          art_ref_typecode((art_ref_t)in_RDX);
          art_replace((art_inner_node_t *)in_stack_ffffffffffffff80,
                      (art_typecode_t)((ushort)uVar6 >> 8),(art_key_chunk_t)uVar6,
                      (art_ref_t)new_child);
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

static art_erase_result_t art_erase_at(art_t *art, art_ref_t ref,
                                       const art_key_chunk_t *key,
                                       uint8_t depth) {
    art_erase_result_t result;
    result.rootmost_node = CROARING_ART_NULL_REF;
    result.erased = false;

    if (art_is_leaf(ref)) {
        art_leaf_t *leaf = (art_leaf_t *)art_deref(art, ref);
        uint8_t common_prefix = art_common_prefix(leaf->key, 0, ART_KEY_BYTES,
                                                  key, 0, ART_KEY_BYTES);
        if (common_prefix != ART_KEY_BYTES) {
            // Leaf key mismatch.
            return result;
        }
        result.erased = true;
        result.value_erased = leaf->val;
        art_node_free(art, (art_node_t *)leaf, CROARING_ART_LEAF_TYPE);
        return result;
    }
    art_inner_node_t *inner_node = (art_inner_node_t *)art_deref(art, ref);
    uint8_t common_prefix =
        art_common_prefix(inner_node->prefix, 0, inner_node->prefix_size, key,
                          depth, ART_KEY_BYTES);
    if (common_prefix != inner_node->prefix_size) {
        // Prefix mismatch.
        return result;
    }
    art_key_chunk_t key_chunk = key[depth + common_prefix];
    art_ref_t child =
        art_find_child(inner_node, art_ref_typecode(ref), key_chunk);
    if (child == CROARING_ART_NULL_REF) {
        // No child with key chunk.
        return result;
    }
    // Try to erase the key further down. Skip the key chunk associated with
    // the child in the node.
    art_erase_result_t child_result =
        art_erase_at(art, child, key, depth + common_prefix + 1);
    if (!child_result.erased) {
        return result;
    }
    result.erased = true;
    result.value_erased = child_result.value_erased;
    result.rootmost_node = ref;

    // Deref again as nodes may have changed location.
    inner_node = (art_inner_node_t *)art_deref(art, ref);
    if (child_result.rootmost_node == CROARING_ART_NULL_REF) {
        // Child node was fully erased, erase it from this node's children.
        result.rootmost_node =
            art_node_erase(art, inner_node, art_ref_typecode(ref), key_chunk);
    } else if (child_result.rootmost_node != child) {
        // Child node was not fully erased, update the pointer to it in this
        // node.
        art_replace(inner_node, art_ref_typecode(ref), key_chunk,
                    child_result.rootmost_node);
    }
    return result;
}